

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O3

void __thiscall
duckdb::UnionByReaderTask<duckdb::CSVMultiFileInfo,_duckdb::CSVReaderOptions>::ExecuteTask
          (UnionByReaderTask<duckdb::CSVMultiFileInfo,_duckdb::CSVReaderOptions> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  reference pvVar1;
  shared_ptr<duckdb::BaseFileReader,_true> local_48;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  CSVMultiFileInfo::CreateReader
            ((CSVMultiFileInfo *)&local_28,this->context,this->file,this->options,this->file_options
            );
  local_48.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  local_48.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_20;
  CSVMultiFileInfo::GetUnionData((CSVMultiFileInfo *)&local_38,&local_48,this->file_idx);
  pvVar1 = vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true>::operator[]
                     (this->readers,this->file_idx);
  this_00 = (pvVar1->internal).super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (pvVar1->internal).super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  (pvVar1->internal).super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_30;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_48.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.internal.
               super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ExecuteTask() override {
		auto reader = OP::CreateReader(context, file, options, file_options);
		readers[file_idx] = OP::GetUnionData(std::move(reader), file_idx);
	}